

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int xmlCharEncOutput(xmlOutputBufferPtr output,int init)

{
  xmlBufPtr buf_00;
  xmlBufPtr buf_01;
  xmlCharEncodingHandler *pxVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  xmlChar *pxVar5;
  size_t sVar6;
  xmlChar *in;
  byte *pbVar7;
  int iVar8;
  uint uVar9;
  int c_out;
  int c_in;
  int len;
  xmlChar charref [20];
  char buf [50];
  int local_9c;
  int local_98;
  int local_94;
  byte *local_90;
  uchar local_88 [32];
  char local_68 [49];
  undefined1 local_37;
  
  iVar8 = -1;
  if ((((output != (xmlOutputBufferPtr)0x0) && (output->encoder != (xmlCharEncodingHandlerPtr)0x0))
      && (buf_00 = output->buffer, buf_00 != (xmlBufPtr)0x0)) &&
     (buf_01 = output->conv, buf_01 != (xmlBufPtr)0x0)) {
    sVar4 = xmlBufAvail(buf_01);
    if (init == 0) {
      sVar6 = xmlBufUse(buf_00);
      if (sVar6 == 0) {
        iVar8 = 0;
      }
      else {
        iVar8 = 0;
        do {
          if (0xffff < sVar6) {
            sVar6 = 0x10000;
          }
          uVar9 = (int)sVar6 * 4;
          if (sVar4 <= uVar9) {
            xmlBufGrow(buf_01,uVar9);
            sVar4 = xmlBufAvail(buf_01);
          }
          if (0x3ffff < sVar4) {
            sVar4 = 0x40000;
          }
          local_9c = (int)sVar4;
          pxVar1 = output->encoder;
          local_98 = (int)sVar6;
          pxVar5 = xmlBufEnd(buf_01);
          in = xmlBufContent(buf_00);
          iVar2 = xmlEncOutputChunk(pxVar1,pxVar5,&local_9c,in,&local_98);
          xmlBufShrink(buf_00,(long)local_98);
          xmlBufAddLen(buf_01,(long)local_9c);
          iVar8 = iVar8 + local_9c;
          if (iVar2 == -2) {
            sVar4 = xmlBufUse(buf_00);
            local_94 = (int)sVar4;
            pbVar7 = xmlBufContent(buf_00);
            uVar9 = xmlGetUTF8Char(pbVar7,&local_94);
            if ((int)uVar9 < 1) {
              iVar2 = -2;
              goto LAB_00144f58;
            }
            local_90 = pbVar7;
            iVar3 = snprintf((char *)local_88,0x14,"&#%d;",(ulong)uVar9);
            xmlBufShrink(buf_00,(long)local_94);
            xmlBufGrow(buf_01,iVar3 * 4);
            sVar4 = xmlBufAvail(buf_01);
            local_9c = (int)sVar4;
            pxVar1 = output->encoder;
            local_98 = iVar3;
            pxVar5 = xmlBufEnd(buf_01);
            iVar2 = xmlEncOutputChunk(pxVar1,pxVar5,&local_9c,local_88,&local_98);
            pbVar7 = local_90;
            if ((iVar2 < 0) || (local_98 != iVar3)) {
              snprintf(local_68,0x31,"0x%02X 0x%02X 0x%02X 0x%02X",(ulong)*local_90,
                       (ulong)local_90[1],(ulong)local_90[2],(uint)local_90[3]);
              local_37 = 0;
              __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                              (void *)0x0,(void *)0x0,0x1b,0x1773,XML_ERR_FATAL,(char *)0x0,0,
                              local_68,(char *)0x0,(char *)0x0,0,0,
                              "output conversion failed due to conv error, bytes %s\n",local_68);
              iVar3 = xmlBufGetAllocationScheme(buf_00);
              if (iVar3 != 2) {
                *pbVar7 = 0x20;
              }
              goto LAB_00144f58;
            }
            xmlBufAddLen(buf_01,(long)local_9c);
            iVar8 = iVar8 + local_9c;
          }
          else {
            if (iVar2 != -1) {
              if (iVar2 == -4) {
                __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                                (void *)0x0,(void *)0x0,0x1b,0x1774,XML_ERR_FATAL,(char *)0x0,0,
                                (char *)0x0,(char *)0x0,(char *)0x0,0,0,
                                "xmlCharEncOutFunc: no output function !\n",0);
                iVar2 = -1;
              }
LAB_00144f58:
              if (iVar8 != 0) {
                return iVar8;
              }
              return iVar2;
            }
            if (local_9c < 1) {
              iVar2 = -3;
              goto LAB_00144f58;
            }
          }
          sVar4 = xmlBufAvail(buf_01);
          sVar6 = xmlBufUse(buf_00);
        } while (sVar6 != 0);
      }
    }
    else {
      local_98 = 0;
      local_9c = (int)sVar4;
      pxVar1 = output->encoder;
      pxVar5 = xmlBufEnd(buf_01);
      xmlEncOutputChunk(pxVar1,pxVar5,&local_9c,(uchar *)0x0,&local_98);
      xmlBufAddLen(buf_01,(long)local_9c);
      iVar8 = local_9c;
    }
  }
  return iVar8;
}

Assistant:

int
xmlCharEncOutput(xmlOutputBufferPtr output, int init)
{
    int ret;
    size_t written;
    int writtentot = 0;
    size_t toconv;
    int c_in;
    int c_out;
    xmlBufPtr in;
    xmlBufPtr out;

    if ((output == NULL) || (output->encoder == NULL) ||
        (output->buffer == NULL) || (output->conv == NULL))
        return (-1);
    out = output->conv;
    in = output->buffer;

retry:

    written = xmlBufAvail(out);

    /*
     * First specific handling of the initialization call
     */
    if (init) {
        c_in = 0;
        c_out = written;
        /* TODO: Check return value. */
        xmlEncOutputChunk(output->encoder, xmlBufEnd(out), &c_out,
                          NULL, &c_in);
        xmlBufAddLen(out, c_out);
#ifdef DEBUG_ENCODING
	xmlGenericError(xmlGenericErrorContext,
		"initialized encoder\n");
#endif
        return(c_out);
    }

    /*
     * Conversion itself.
     */
    toconv = xmlBufUse(in);
    if (toconv == 0)
        return (writtentot);
    if (toconv > 64 * 1024)
        toconv = 64 * 1024;
    if (toconv * 4 >= written) {
        xmlBufGrow(out, toconv * 4);
        written = xmlBufAvail(out);
    }
    if (written > 256 * 1024)
        written = 256 * 1024;

    c_in = toconv;
    c_out = written;
    ret = xmlEncOutputChunk(output->encoder, xmlBufEnd(out), &c_out,
                            xmlBufContent(in), &c_in);
    xmlBufShrink(in, c_in);
    xmlBufAddLen(out, c_out);
    writtentot += c_out;
    if (ret == -1) {
        if (c_out > 0) {
            /* Can be a limitation of iconv or uconv */
            goto retry;
        }
        ret = -3;
    }

    /*
     * Attempt to handle error cases
     */
    switch (ret) {
        case 0:
#ifdef DEBUG_ENCODING
	    xmlGenericError(xmlGenericErrorContext,
		    "converted %d bytes to %d bytes of output\n",
	            c_in, c_out);
#endif
	    break;
        case -1:
#ifdef DEBUG_ENCODING
	    xmlGenericError(xmlGenericErrorContext,
		    "output conversion failed by lack of space\n");
#endif
	    break;
        case -3:
#ifdef DEBUG_ENCODING
	    xmlGenericError(xmlGenericErrorContext,"converted %d bytes to %d bytes of output %d left\n",
	            c_in, c_out, (int) xmlBufUse(in));
#endif
	    break;
        case -4:
            xmlEncodingErr(XML_I18N_NO_OUTPUT,
                           "xmlCharEncOutFunc: no output function !\n", NULL);
            ret = -1;
            break;
        case -2: {
	    xmlChar charref[20];
	    int len = xmlBufUse(in);
            xmlChar *content = xmlBufContent(in);
	    int cur, charrefLen;

	    cur = xmlGetUTF8Char(content, &len);
	    if (cur <= 0)
                break;

#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
                    "handling output conversion error\n");
            xmlGenericError(xmlGenericErrorContext,
                    "Bytes: 0x%02X 0x%02X 0x%02X 0x%02X\n",
                    content[0], content[1],
                    content[2], content[3]);
#endif
            /*
             * Removes the UTF8 sequence, and replace it by a charref
             * and continue the transcoding phase, hoping the error
             * did not mangle the encoder state.
             */
            charrefLen = snprintf((char *) &charref[0], sizeof(charref),
                             "&#%d;", cur);
            xmlBufShrink(in, len);
            xmlBufGrow(out, charrefLen * 4);
            c_out = xmlBufAvail(out);
            c_in = charrefLen;
            ret = xmlEncOutputChunk(output->encoder, xmlBufEnd(out), &c_out,
                                    charref, &c_in);

	    if ((ret < 0) || (c_in != charrefLen)) {
		char buf[50];

		snprintf(&buf[0], 49, "0x%02X 0x%02X 0x%02X 0x%02X",
			 content[0], content[1],
			 content[2], content[3]);
		buf[49] = 0;
		xmlEncodingErr(XML_I18N_CONV_FAILED,
		    "output conversion failed due to conv error, bytes %s\n",
			       buf);
		if (xmlBufGetAllocationScheme(in) != XML_BUFFER_ALLOC_IMMUTABLE)
		    content[0] = ' ';
                break;
	    }

            xmlBufAddLen(out, c_out);
            writtentot += c_out;
            goto retry;
	}
    }
    return(writtentot ? writtentot : ret);
}